

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O0

ostream * wasm::WATParser::operator<<(ostream *os,FloatTok *tok)

{
  bool bVar1;
  uint uVar2;
  ostream *this;
  void *pvVar3;
  unsigned_long *puVar4;
  char *local_30;
  FloatTok *tok_local;
  ostream *os_local;
  
  uVar2 = std::isnan(tok->d);
  if ((uVar2 & 1) == 0) {
    os_local = (ostream *)std::ostream::operator<<(os,tok->d);
  }
  else {
    bVar1 = std::signbit(tok->d);
    if (bVar1) {
      local_30 = "+";
    }
    else {
      local_30 = "-";
    }
    std::operator<<(os,local_30);
    bVar1 = std::optional::operator_cast_to_bool((optional *)tok);
    if (bVar1) {
      this = std::operator<<(os,"nan:0x");
      pvVar3 = (void *)std::ostream::operator<<(this,std::hex);
      puVar4 = std::optional<unsigned_long>::operator*(&tok->nanPayload);
      pvVar3 = (void *)std::ostream::operator<<(pvVar3,*puVar4);
      os_local = (ostream *)std::ostream::operator<<(pvVar3,std::dec);
    }
    else {
      os_local = std::operator<<(os,"nan");
    }
  }
  return os_local;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const FloatTok& tok) {
  if (std::isnan(tok.d)) {
    os << (std::signbit(tok.d) ? "+" : "-");
    if (tok.nanPayload) {
      return os << "nan:0x" << std::hex << *tok.nanPayload << std::dec;
    }
    return os << "nan";
  }
  return os << tok.d;
}